

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

bool __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::ExamineIfOptionIsSet
          (OptionInterpreter *this,const_iterator intermediate_fields_iter,
          const_iterator intermediate_fields_end,FieldDescriptor *innermost_field,
          string *debug_msg_name,UnknownFieldSet *unknown_fields)

{
  byte bVar1;
  undefined8 *puVar2;
  bool bVar3;
  long *plVar4;
  LogMessage *pLVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  _Alloc_hider _Var10;
  pointer pUVar11;
  long lVar12;
  UnknownFieldSet intermediate_unknown_fields;
  undefined1 local_98 [56];
  const_iterator local_60;
  const_iterator local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pUVar11 = (unknown_fields->fields_).
            super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar9 = (uint)((ulong)((long)(unknown_fields->fields_).
                               super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar11) >> 4);
  local_58._M_current = intermediate_fields_end._M_current;
  if (intermediate_fields_iter._M_current == intermediate_fields_end._M_current) {
    if (0 < (int)uVar9) {
      uVar7 = 0;
      while (pUVar11->number_ != *(uint32_t *)(innermost_field + 4)) {
        uVar7 = uVar7 + 1;
        pUVar11 = pUVar11 + 1;
        if ((uVar9 & 0x7fffffff) == uVar7) {
          return (uVar9 & 0x7fffffff) <= uVar7;
        }
      }
      std::operator+(&local_50,"Option \"",debug_msg_name);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
      paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 == paVar6) {
        local_98._16_8_ = paVar6->_M_allocated_capacity;
        local_98._24_8_ = plVar4[3];
        local_98._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_98 + 0x10);
      }
      else {
        local_98._16_8_ = paVar6->_M_allocated_capacity;
        local_98._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar4;
      }
      local_98._8_8_ = plVar4[1];
      *plVar4 = (long)paVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      AddError(this->builder_,&this->options_to_interpret_->element_name,
               &this->uninterpreted_option_->super_Message,OPTION_NAME,(string *)local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_98 + 0x10)) {
        operator_delete((void *)local_98._0_8_);
      }
      _Var10._M_p = local_50._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
LAB_0035f406:
        operator_delete(_Var10._M_p);
      }
      return false;
    }
  }
  else {
    if ((int)uVar9 < 1) {
      return true;
    }
    local_60._M_current = intermediate_fields_iter._M_current + 1;
    lVar12 = 8;
    lVar8 = 0;
    do {
      paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*intermediate_fields_iter._M_current;
      if (*(int *)((long)pUVar11 + lVar12 + -8) == *(int *)(paVar6->_M_local_buf + 4)) {
        if (*(once_flag **)(paVar6->_M_local_buf + 0x18) != (once_flag *)0x0) {
          local_98._0_8_ = FieldDescriptor::TypeOnceInit;
          local_50._M_dataplus._M_p = (pointer)paVar6;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (*(once_flag **)(paVar6->_M_local_buf + 0x18),
                     (_func_void_FieldDescriptor_ptr **)local_98,(FieldDescriptor **)&local_50);
        }
        bVar1 = paVar6->_M_local_buf[2];
        if (bVar1 == 10) {
          if ((*(int *)((long)pUVar11 + lVar12 + -4) == 4) &&
             (bVar3 = ExamineIfOptionIsSet
                                (this,local_60,local_58,innermost_field,debug_msg_name,
                                 *(UnknownFieldSet **)((long)&pUVar11->number_ + lVar12)), !bVar3))
          {
            return false;
          }
        }
        else {
          if (bVar1 != 0xb) {
            internal::LogMessage::LogMessage
                      ((LogMessage *)local_98,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
                       ,0x1cf9);
            pLVar5 = internal::LogMessage::operator<<
                               ((LogMessage *)local_98,"Invalid wire type for CPPTYPE_MESSAGE: ");
            pLVar5 = internal::LogMessage::operator<<(pLVar5,(uint)bVar1);
            internal::LogFinisher::operator=((LogFinisher *)&local_50,pLVar5);
            internal::LogMessage::~LogMessage((LogMessage *)local_98);
            return false;
          }
          if (*(int *)((long)pUVar11 + lVar12 + -4) == 3) {
            local_98._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            local_98._8_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            local_98._16_8_ = (pointer)0x0;
            if (*(int *)((long)pUVar11 + lVar12 + -4) != 3) {
              __assert_fail("type() == TYPE_LENGTH_DELIMITED",
                            "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/unknown_field_set.h"
                            ,0x166,
                            "const std::string &google::protobuf::UnknownField::length_delimited() const"
                           );
            }
            puVar2 = *(undefined8 **)((long)&pUVar11->number_ + lVar12);
            bVar3 = UnknownFieldSet::ParseFromArray
                              ((UnknownFieldSet *)local_98,(void *)*puVar2,*(int *)(puVar2 + 1));
            if ((bVar3) &&
               (bVar3 = ExamineIfOptionIsSet
                                  (this,local_60,local_58,innermost_field,debug_msg_name,
                                   (UnknownFieldSet *)local_98), !bVar3)) {
              if (local_98._0_8_ != local_98._8_8_) {
                UnknownFieldSet::ClearFallback((UnknownFieldSet *)local_98);
              }
              _Var10._M_p = (pointer)local_98._0_8_;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_98._0_8_ ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                return false;
              }
              goto LAB_0035f406;
            }
            if (local_98._0_8_ != local_98._8_8_) {
              UnknownFieldSet::ClearFallback((UnknownFieldSet *)local_98);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              operator_delete((void *)local_98._0_8_);
            }
          }
        }
      }
      lVar8 = lVar8 + 1;
      pUVar11 = (unknown_fields->fields_).
                super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar12 = lVar12 + 0x10;
    } while (lVar8 < (int)((ulong)((long)(unknown_fields->fields_).
                                         super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar11)
                          >> 4));
  }
  return true;
}

Assistant:

bool DescriptorBuilder::OptionInterpreter::ExamineIfOptionIsSet(
    std::vector<const FieldDescriptor*>::const_iterator
        intermediate_fields_iter,
    std::vector<const FieldDescriptor*>::const_iterator intermediate_fields_end,
    const FieldDescriptor* innermost_field, const std::string& debug_msg_name,
    const UnknownFieldSet& unknown_fields) {
  // We do linear searches of the UnknownFieldSet and its sub-groups.  This
  // should be fine since it's unlikely that any one options structure will
  // contain more than a handful of options.

  if (intermediate_fields_iter == intermediate_fields_end) {
    // We're at the innermost submessage.
    for (int i = 0; i < unknown_fields.field_count(); i++) {
      if (unknown_fields.field(i).number() == innermost_field->number()) {
        return AddNameError("Option \"" + debug_msg_name +
                            "\" was already set.");
      }
    }
    return true;
  }

  for (int i = 0; i < unknown_fields.field_count(); i++) {
    if (unknown_fields.field(i).number() ==
        (*intermediate_fields_iter)->number()) {
      const UnknownField* unknown_field = &unknown_fields.field(i);
      FieldDescriptor::Type type = (*intermediate_fields_iter)->type();
      // Recurse into the next submessage.
      switch (type) {
        case FieldDescriptor::TYPE_MESSAGE:
          if (unknown_field->type() == UnknownField::TYPE_LENGTH_DELIMITED) {
            UnknownFieldSet intermediate_unknown_fields;
            if (intermediate_unknown_fields.ParseFromString(
                    unknown_field->length_delimited()) &&
                !ExamineIfOptionIsSet(intermediate_fields_iter + 1,
                                      intermediate_fields_end, innermost_field,
                                      debug_msg_name,
                                      intermediate_unknown_fields)) {
              return false;  // Error already added.
            }
          }
          break;

        case FieldDescriptor::TYPE_GROUP:
          if (unknown_field->type() == UnknownField::TYPE_GROUP) {
            if (!ExamineIfOptionIsSet(intermediate_fields_iter + 1,
                                      intermediate_fields_end, innermost_field,
                                      debug_msg_name, unknown_field->group())) {
              return false;  // Error already added.
            }
          }
          break;

        default:
          GOOGLE_LOG(FATAL) << "Invalid wire type for CPPTYPE_MESSAGE: " << type;
          return false;
      }
    }
  }
  return true;
}